

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O1

void __thiscall CTcMake::get_objfile(CTcMake *this,textchar_t *dst,CTcMakeModule *mod)

{
  char *path;
  textchar_t *ptVar1;
  char *pcVar2;
  size_t sVar3;
  size_t __n;
  
  path = (this->objdir_).buf_;
  ptVar1 = (mod->obj_).buf_;
  pcVar2 = "";
  if (ptVar1 != (textchar_t *)0x0) {
    pcVar2 = ptVar1;
  }
  if (path != (char *)0x0) {
    pcVar2 = os_get_root_name(pcVar2);
    os_build_full_path(dst,0x1000,path,pcVar2);
    return;
  }
  sVar3 = strlen(pcVar2);
  __n = 0xfff;
  if (sVar3 < 0xfff) {
    __n = sVar3;
  }
  memcpy(dst,pcVar2,__n);
  dst[__n] = '\0';
  return;
}

Assistant:

void CTcMake::get_objfile(textchar_t *dst, CTcMakeModule *mod)
{
    /*
     *   If an object path is specified, remove the path part of the module
     *   name and add the root filename to the object path, since the object
     *   path overrides the source file path.  Otherwise, use the name as
     *   given.  
     */
    if (objdir_.is_set())
        os_build_full_path(dst, OSFNMAX, objdir_.get(),
                           os_get_root_name((char *)mod->get_object_name()));
    else
        lib_strcpy(dst, OSFNMAX, mod->get_object_name());
}